

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O1

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::append(TiXmlString *this,char *str,size_type len)

{
  ulong uVar1;
  Rep *pRVar2;
  ulong uVar3;
  
  uVar3 = this->rep_->size + len;
  uVar1 = this->rep_->capacity;
  if (uVar1 < uVar3) {
    reserve(this,uVar1 + uVar3);
  }
  memmove(this->rep_->str + this->rep_->size,str,len);
  pRVar2 = this->rep_;
  pRVar2->size = uVar3;
  pRVar2->str[uVar3] = '\0';
  return this;
}

Assistant:

TiXmlString& TiXmlString::append(const char* str, size_type len) {
	size_type newsize = length() + len;
	if (newsize > capacity()) {
		reserve(newsize + capacity());
	}
	memmove(finish(), str, len);
	set_size(newsize);
	return *this;
}